

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::~section_impl(section_impl<ELFIO::Elf64_Shdr> *this)

{
  ~section_impl(this);
  operator_delete(this);
  return;
}

Assistant:

~section_impl()
    {
        delete [] data;
    }